

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int ARKodeSVtolerances(void *arkode_mem,sunrealtype reltol,N_Vector abstol)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar1 = 0x136;
  }
  else if (*(int *)((long)arkode_mem + 0x3c0) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    error_code = -0x17;
    iVar1 = 0x13f;
  }
  else if (0.0 <= reltol) {
    if (abstol == (N_Vector)0x0) {
      msgfmt = "abstol = NULL illegal.";
      error_code = -0x16;
      iVar1 = 0x14b;
    }
    else if (abstol->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0) {
      msgfmt = "Missing N_VMin routine from N_Vector";
      error_code = -0x16;
      iVar1 = 0x151;
    }
    else {
      dVar2 = (double)N_VMin(abstol);
      if (0.0 <= dVar2) {
        *(uint *)((long)arkode_mem + 0x38) = -(uint)(dVar2 == 0.0) & 1;
        if (*(int *)((long)arkode_mem + 0x3b8) == 0) {
          iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x230),
                              (N_Vector *)((long)arkode_mem + 0x30));
          if (iVar1 == 0) {
            arkProcessError((ARKodeMem)arkode_mem,-0x14,0x165,"ARKodeSVtolerances",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"Allocation of arkode_mem failed.");
            return -0x16;
          }
          *(undefined4 *)((long)arkode_mem + 0x3b8) = 1;
        }
        N_VScale(0x3ff0000000000000,abstol,*(undefined8 *)((long)arkode_mem + 0x30));
        *(sunrealtype *)((long)arkode_mem + 0x20) = reltol;
        *(undefined4 *)((long)arkode_mem + 0x18) = 1;
        *(undefined4 *)((long)arkode_mem + 0x54) = 0;
        *(code **)((long)arkode_mem + 0x58) = arkEwtSetSV;
        *(void **)((long)arkode_mem + 0x60) = arkode_mem;
        return 0;
      }
      msgfmt = "abstol has negative component(s) (illegal).";
      error_code = -0x16;
      iVar1 = 0x158;
    }
  }
  else {
    msgfmt = "reltol < 0 illegal.";
    error_code = -0x16;
    iVar1 = 0x145;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSVtolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSVtolerances(void* arkode_mem, sunrealtype reltol, N_Vector abstol)
{
  /* local variables */
  sunrealtype abstolmin;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (reltol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RELTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_ABSTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol->ops->nvmin == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Missing N_VMin routine from N_Vector");
    return (ARK_ILL_INPUT);
  }
  abstolmin = N_VMin(abstol);
  if (abstolmin < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->atolmin0 = (abstolmin == ZERO);

  /* Copy tolerances into memory */
  if (!(ark_mem->VabstolMallocDone))
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->Vabstol)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->VabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, abstol, ark_mem->Vabstol);
  ark_mem->reltol = reltol;
  ark_mem->itol   = ARK_SV;

  /* enforce use of arkEwtSetSV */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSV;
  ark_mem->e_data    = ark_mem;

  return (ARK_SUCCESS);
}